

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O3

bool __thiscall
matchit::impl::Id<mathiu::impl::Pair>::matchValue<mathiu::impl::Pair_const&>
          (Id<mathiu::impl::Pair> *this,Pair *v)

{
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1179:45)>,_const_std::variant<std::monostate,_mathiu::impl::Pair,_mathiu::impl::Pair_*,_const_mathiu::impl::Pair_*>_&>
  _Var1;
  bool bVar2;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>_&>
  pIVar3;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Pair,_mathiu::impl::Pair_*,_const_mathiu::impl::Pair_*>_&>
  lhs;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
  local_15;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1179:45)>
  local_14;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
  local_13;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
  local_12;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
  local_11;
  
  pIVar3 = std::
           visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>&)_1_,matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Pair>,matchit::impl::IdBlock<mathiu::impl::Pair>*>&>
                     (&local_15,&this->mBlock);
  _Var1 = std::
          visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Pair>::hasValue()const::_lambda(mathiu::impl::Pair_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::hasValue()const::_lambda(mathiu::impl::Pair_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::hasValue()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Pair,mathiu::impl::Pair*,mathiu::impl::Pair_const*>const&>
                    (&local_14,&(pIVar3->super_IdBlockBase<mathiu::impl::Pair>).mVariant);
  if (_Var1) {
    pIVar3 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>&)_1_,matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Pair>,matchit::impl::IdBlock<mathiu::impl::Pair>*>&>
                       (&local_13,&this->mBlock);
    lhs = std::
          visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair*)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Pair,mathiu::impl::Pair*,mathiu::impl::Pair_const*>const&>
                    (&local_12,&(pIVar3->super_IdBlockBase<mathiu::impl::Pair>).mVariant);
    bVar2 = mathiu::impl::equal((ExprPtr *)lhs,(ExprPtr *)v);
    if (bVar2) {
      bVar2 = mathiu::impl::equal(&(lhs->super_ExprPtrPair).second,&(v->super_ExprPtrPair).second);
    }
    else {
      bVar2 = false;
    }
  }
  else {
    pIVar3 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>&)_1_,matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Pair>,matchit::impl::IdBlock<mathiu::impl::Pair>*>&>
                       (&local_11,&this->mBlock);
    IdUtil<mathiu::impl::Pair>::bindValue<mathiu::impl::Pair_const&>
              (&(pIVar3->super_IdBlockBase<mathiu::impl::Pair>).mVariant,v);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }